

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O2

bool __thiscall COLLADASaxFWL::MeshLoader::initializeTexCoordsOffset(MeshLoader *this)

{
  size_t sVar1;
  InputShared *pIVar2;
  bool bVar3;
  SourceBase *pSVar4;
  size_t sVar5;
  value_type *this_00;
  uint local_bc;
  PrimitiveInput texCoord;
  String sourceId;
  
  sVar1 = (this->mMeshPrimitiveInputs).mInputArray.mCount;
  local_bc = (uint)&this->mTexCoordList;
  for (sVar5 = 0; sVar1 != sVar5; sVar5 = sVar5 + 1) {
    pIVar2 = (this->mMeshPrimitiveInputs).mInputArray.mData[sVar5];
    if ((pIVar2->super_InputUnshared).mSemantic == TEXCOORD) {
      std::__cxx11::string::string
                ((string *)&sourceId,(string *)&(pIVar2->super_InputUnshared).mSource.mFragment);
      pSVar4 = SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&sourceId);
      if (pSVar4 == (SourceBase *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&stack0xffffffffffffffb0,
                   "SourceBase of tex coords with semantic TEXCOORD not valid!",
                   (allocator<char> *)&texCoord);
        bVar3 = IFilePartLoader::handleFWLError
                          ((IFilePartLoader *)this,ERROR_DATA_NOT_VALID,
                           (String *)&stack0xffffffffffffffb0,SEVERITY_ERROR_NONCRITICAL);
        local_bc = (uint)bVar3;
        this_00 = (value_type *)&stack0xffffffffffffffb0;
      }
      else {
        texCoord.mStride = pSVar4->mStride;
        texCoord.mInitialIndex = pSVar4->mInitialIndex / texCoord.mStride;
        texCoord.mName._M_dataplus._M_p = (pointer)&texCoord.mName.field_2;
        texCoord.mName._M_string_length = 0;
        texCoord.mName.field_2._M_local_buf[0] = '\0';
        texCoord.mOffset = pIVar2->mOffset;
        texCoord.mSetIndex = pIVar2->mSet;
        std::__cxx11::string::_M_assign((string *)&texCoord);
        std::
        vector<COLLADASaxFWL::MeshLoader::PrimitiveInput,_std::allocator<COLLADASaxFWL::MeshLoader::PrimitiveInput>_>
        ::push_back(&this->mTexCoordList,&texCoord);
        this_00 = &texCoord;
      }
      std::__cxx11::string::~string((string *)this_00);
      std::__cxx11::string::~string((string *)&sourceId);
      if (pSVar4 == (SourceBase *)0x0) goto LAB_0083d469;
    }
  }
  local_bc._0_1_ = 0;
LAB_0083d469:
  return (bool)((byte)local_bc & 1);
}

Assistant:

bool MeshLoader::initializeTexCoordsOffset ()
    {
        // Check for using tex coordinates 
        const InputSharedArray& inputArray = mMeshPrimitiveInputs.getInputArray ();
        size_t numInputs = inputArray.getCount ();

        for ( size_t i=0; i<numInputs; ++i )
        {
            const InputShared* input = inputArray [i];
            if ( input->getSemantic () == InputSemantic::TEXCOORD )
            {
                // TODO Id management!
                String sourceId = input->getSource ().getFragment ();
                SourceBase* sourceBase = getSourceById ( sourceId );
                if ( sourceBase == 0 ) 
                {
                    return handleFWLError ( SaxFWLError::ERROR_DATA_NOT_VALID, "SourceBase of tex coords with semantic TEXCOORD not valid!" );
                }

                // only stride 1, 2, 3 or 4 makes sense for uv coords
                size_t stride = ( size_t ) sourceBase->getStride();
                COLLADABU_ASSERT ( (stride >= 1) || (stride <= 4) ); 

                size_t intitialIndex = sourceBase->getInitialIndex ();
                size_t indexOffset = intitialIndex / stride;
 
                PrimitiveInput texCoord;
                texCoord.mOffset = ( size_t ) input->getOffset ();
                texCoord.mInitialIndex = indexOffset;
                texCoord.mStride = stride;
                texCoord.mSetIndex = ( size_t ) input->getSet ();
                texCoord.mName = sourceId;

                mTexCoordList.push_back ( texCoord );
            }
        }
		return false;
    }